

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_detection.cpp
# Opt level: O0

void anon_unknown.dwarf_71625::createPositiveXEdge<double>
               (vector<double,_std::allocator<double>_> *data,
               vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *point,double x,
               double y)

{
  bool bVar1;
  reference pdVar2;
  value_type *in_RSI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  const_iterator dataX;
  value_type *in_stack_ffffffffffffffb8;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *in_stack_ffffffffffffffc0;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_28;
  double local_20;
  double local_18;
  value_type *local_10;
  
  local_20 = in_XMM1_Qa;
  local_18 = in_XMM0_Qa;
  local_10 = in_RSI;
  local_28._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::cbegin
                 ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffb8);
  while( true ) {
    std::vector<double,_std::allocator<double>_>::cend
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffb8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                        *)in_stack_ffffffffffffffc0,
                       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    in_stack_ffffffffffffffb8 = local_10;
    pdVar2 = __gnu_cxx::
             __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_28);
    PointBase2D<double>::PointBase2D
              ((PointBase2D<double> *)&stack0xffffffffffffffc0,*pdVar2 + local_18,local_20);
    std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::push_back
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_28);
  }
  return;
}

Assistant:

void createPositiveXEdge( const std::vector< _Type > & data, std::vector < PointBase2D<_Type> > & point, _Type x, _Type y )
    {
        for ( typename std::vector < _Type >::const_iterator dataX = data.cbegin(); dataX != data.cend(); ++dataX )
            point.push_back( PointBase2D<_Type>( (*dataX) + x, y ) );
    }